

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.h
# Opt level: O0

void __thiscall
slang::ast::RangeSelectExpression::visitExprs<slang::ast::NetAliasVisitor&>
          (RangeSelectExpression *this,NetAliasVisitor *visitor)

{
  Expression *in_RSI;
  NetAliasVisitor *in_RDI;
  
  value((RangeSelectExpression *)in_RDI);
  Expression::visit<slang::ast::NetAliasVisitor&>(in_RSI,in_RDI);
  left((RangeSelectExpression *)in_RDI);
  Expression::visit<slang::ast::NetAliasVisitor&>(in_RSI,in_RDI);
  right((RangeSelectExpression *)in_RDI);
  Expression::visit<slang::ast::NetAliasVisitor&>(in_RSI,in_RDI);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        value().visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }